

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O1

void vault_objects(chunk_conflict *c,loc_conflict grid,wchar_t depth,wchar_t num)

{
  bool bVar1;
  loc grid_00;
  _Bool _Var2;
  uint32_t uVar3;
  uint uVar4;
  loc_conflict near;
  loc local_38;
  
  if (num < L'\x01') {
    return;
  }
LAB_0015a46e:
  _Var2 = find_nearby_grid(c,(loc_conflict *)&local_38,grid,L'\x02',L'\x03');
  if (!_Var2) {
LAB_0015a54b:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-util.c"
                  ,0x36c,"void vault_objects(struct chunk *, struct loc, int, int)");
  }
  uVar4 = 0;
  do {
    grid_00 = local_38;
    _Var2 = square_canputitem(c,local_38);
    if (_Var2) {
      uVar3 = Rand_div(100);
      if ((int)uVar3 < 0x4b) {
        place_object(c,(loc_conflict)grid_00,depth,false,false,'\x03',L'\0');
      }
      else {
        place_gold(c,(loc_conflict)grid_00,depth,'\x05');
      }
      if (_Var2 || 9 < uVar4) break;
    }
    else if (9 < uVar4) break;
    uVar4 = uVar4 + 1;
    _Var2 = find_nearby_grid(c,(loc_conflict *)&local_38,grid,L'\x02',L'\x03');
    if (!_Var2) goto LAB_0015a54b;
  } while( true );
  bVar1 = num < L'\x02';
  num = num + L'\xffffffff';
  if (bVar1) {
    return;
  }
  goto LAB_0015a46e;
}

Assistant:

void vault_objects(struct chunk *c, struct loc grid, int depth, int num)
{
	int i;

	/* Attempt to place 'num' objects */
	for (; num > 0; --num) {
		/* Try up to 11 spots looking for empty space */
		for (i = 0; i < 11; ++i) {
			struct loc near;

			/* Pick a random location */
			if (!find_nearby_grid(c, &near, grid, 2, 3)) assert(0);

			/* Require "clean" floor space */
			if (!square_canputitem(c, near)) continue;

			/* Place an item or gold */
			if (randint0(100) < 75)
				place_object(c, near, depth, false, false, ORIGIN_SPECIAL, 0);
			else
				place_gold(c, near, depth, ORIGIN_VAULT);

			/* Placement accomplished */
			break;
		}
	}
}